

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall ncnn::Requantize::load_param(Requantize *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  fVar2 = ParamDict::get(pd,0,1.0);
  this->scale_in = fVar2;
  fVar2 = ParamDict::get(pd,1,1.0);
  this->scale_out = fVar2;
  iVar1 = ParamDict::get(pd,2,0);
  this->bias_term = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->bias_data_size = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->fusion_relu = iVar1 != 0;
  return 0;
}

Assistant:

int Requantize::load_param(const ParamDict& pd)
{
    scale_in = pd.get(0, 1.f);	// bottom_blob_scale * weight_scale
	scale_out = pd.get(1, 1.f);	// top_blob_scale
    bias_term = pd.get(2, 0);
    bias_data_size = pd.get(3, 0);
    fusion_relu = pd.get(4, 0);

    return 0;
}